

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtExpand(word *pTruth0,int nVars,int *pCut0,int nCutSize0,int *pCut,int nCutSize)

{
  int local_3c;
  int local_38;
  int k;
  int i;
  int nCutSize_local;
  int *pCut_local;
  int nCutSize0_local;
  int *pCut0_local;
  int nVars_local;
  word *pTruth0_local;
  
  local_38 = nCutSize + -1;
  local_3c = nCutSize0 + -1;
  do {
    if (local_38 < 0 || local_3c < 0) {
      if (local_3c == -1) {
        return;
      }
      __assert_fail("k == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                    ,0x59c,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
    }
    if (pCut[local_38] <= pCut0[local_3c]) {
      if (pCut[local_38] != pCut0[local_3c]) {
        __assert_fail("pCut[i] == pCut0[k]",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                      ,0x597,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
      }
      if (local_3c < local_38) {
        Abc_TtSwapVars(pTruth0,nVars,local_3c,local_38);
      }
      local_3c = local_3c + -1;
    }
    local_38 = local_38 + -1;
  } while( true );
}

Assistant:

static inline void Abc_TtExpand( word * pTruth0, int nVars, int * pCut0, int nCutSize0, int * pCut, int nCutSize )
{
    int i, k;
    for ( i = nCutSize - 1, k = nCutSize0 - 1; i >= 0 && k >= 0; i-- )
    {
        if ( pCut[i] > pCut0[k] )
            continue;
        assert( pCut[i] == pCut0[k] );
        if ( k < i )
            Abc_TtSwapVars( pTruth0, nVars, k, i );
        k--;
    }
    assert( k == -1 );
}